

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Observed2ICRS
              (double az,double zen,double *ra,double *dec,double julian_date,double longitude,
              double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
              double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  int iVar1;
  double *in_RSI;
  undefined8 *in_RDI;
  double in_XMM1_Qa;
  double *in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  CEAngleType *in_stack_00000028;
  int err_code;
  CEDate *in_stack_ffffffffffffff20;
  double *return_dec;
  double *return_ra;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  iVar1 = Observed2CIRS(in_XMM1_Qa,(double)in_RDI,in_RSI,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa
                        ,in_XMM6_Qa,in_XMM7_Qa,
                        (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                        in_stack_00000020);
  if (iVar1 == 0) {
    return_dec = (double *)*in_RDI;
    return_ra = (double *)*in_RSI;
    CEDate::CEDate(in_stack_ffffffffffffff20,(double)in_stack_00000028,
                   (CEDateType)((ulong)in_stack_00000020 >> 0x20));
    CIRS2ICRS((double)in_RSI,(double)in_RDI,return_ra,return_dec,in_stack_ffffffffffffff20,
              in_stack_00000028);
    CEDate::~CEDate((CEDate *)0x12a7c8);
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2ICRS(double az, double zen,
                                 double *ra, double *dec,
                                 double julian_date,
                                 double longitude,
                                 double latitude,
                                 double elevation_m,
                                 double pressure_hPa,
                                 double temperature_celsius,
                                 double relative_humidity,
                                 double dut1,
                                 double xp, double yp,
                                 double wavelength_um)
{
    // Convert from Observed -> CIRS
    int err_code = Observed2CIRS(az, zen,
                                 ra, dec,
                                 julian_date,
                                 longitude, latitude,
                                 elevation_m, pressure_hPa,
                                 temperature_celsius, relative_humidity,
                                 dut1, xp, yp, wavelength_um) ;
    if (err_code == 0) {
        // Convert from CIRS -> ICRS
        CIRS2ICRS(*ra, *dec, ra, dec,
                  CEDate(julian_date,CEDateType::JD),
                  CEAngleType::RADIANS) ;
    }
    
    return err_code ;
}